

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitTry(PrintSExpression *this,Try *curr)

{
  ostream *poVar1;
  bool bVar2;
  size_t sVar3;
  Name *pNVar4;
  Expression **ppEVar5;
  Name name;
  Name name_00;
  ulong local_20;
  size_t i;
  Try *curr_local;
  PrintSExpression *this_local;
  
  this->controlFlowDepth = this->controlFlowDepth + 1;
  std::operator<<(this->o,'(');
  printExpressionContents(this,(Expression *)curr);
  incIndent(this);
  doIndent(this->o,this->indent);
  std::operator<<(this->o,'(');
  printMedium(this->o,"do");
  incIndent(this);
  maybePrintImplicitBlock(this,curr->body,true);
  decIndent(this);
  std::operator<<(this->o,"\n");
  for (local_20 = 0;
      sVar3 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(curr->catchTags).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
      local_20 < sVar3; local_20 = local_20 + 1) {
    doIndent(this->o,this->indent);
    printDebugDelimiterLocation(this,(Expression *)curr,(Index)local_20);
    std::operator<<(this->o,'(');
    printMedium(this->o,"catch ");
    pNVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->catchTags).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,local_20);
    poVar1 = (ostream *)(pNVar4->super_IString).str._M_str;
    name.super_IString.str._M_str = (char *)this->o;
    name.super_IString.str._M_len = (size_t)poVar1;
    anon_unknown_217::printName((anon_unknown_217 *)(pNVar4->super_IString).str._M_len,name,poVar1);
    incIndent(this);
    ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&(curr->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,local_20);
    maybePrintImplicitBlock(this,*ppEVar5,true);
    decIndent(this);
    std::operator<<(this->o,"\n");
  }
  bVar2 = Try::hasCatchAll(curr);
  if (bVar2) {
    doIndent(this->o,this->indent);
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                      (&(curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>
                      );
    printDebugDelimiterLocation(this,(Expression *)curr,(Index)sVar3);
    std::operator<<(this->o,'(');
    printMedium(this->o,"catch_all");
    incIndent(this);
    ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                        (&(curr->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    maybePrintImplicitBlock(this,*ppEVar5,true);
    decIndent(this);
    std::operator<<(this->o,"\n");
  }
  this->controlFlowDepth = this->controlFlowDepth + -1;
  bVar2 = Try::isDelegate(curr);
  if (bVar2) {
    doIndent(this->o,this->indent);
    std::operator<<(this->o,'(');
    printMedium(this->o,"delegate ");
    bVar2 = IString::operator==(&(curr->delegateTarget).super_IString,
                                (IString *)&DELEGATE_CALLER_TARGET);
    if (bVar2) {
      std::ostream::operator<<(this->o,this->controlFlowDepth);
    }
    else {
      poVar1 = (ostream *)(curr->delegateTarget).super_IString.str._M_str;
      name_00.super_IString.str._M_str = (char *)this->o;
      name_00.super_IString.str._M_len = (size_t)poVar1;
      anon_unknown_217::printName
                ((anon_unknown_217 *)(curr->delegateTarget).super_IString.str._M_len,name_00,poVar1)
      ;
    }
    std::operator<<(this->o,")\n");
  }
  decIndent(this);
  if ((this->full & 1U) != 0) {
    std::operator<<(this->o," ;; end try");
  }
  return;
}

Assistant:

void visitTry(Try* curr) {
    controlFlowDepth++;
    o << '(';
    printExpressionContents(curr);
    incIndent();
    doIndent(o, indent);
    o << '(';
    printMedium(o, "do");
    incIndent();
    maybePrintImplicitBlock(curr->body, true);
    decIndent();
    o << "\n";
    for (size_t i = 0; i < curr->catchTags.size(); i++) {
      doIndent(o, indent);
      printDebugDelimiterLocation(curr, i);
      o << '(';
      printMedium(o, "catch ");
      printName(curr->catchTags[i], o);
      incIndent();
      maybePrintImplicitBlock(curr->catchBodies[i], true);
      decIndent();
      o << "\n";
    }
    if (curr->hasCatchAll()) {
      doIndent(o, indent);
      printDebugDelimiterLocation(curr, curr->catchTags.size());
      o << '(';
      printMedium(o, "catch_all");
      incIndent();
      maybePrintImplicitBlock(curr->catchBodies.back(), true);
      decIndent();
      o << "\n";
    }
    controlFlowDepth--;

    if (curr->isDelegate()) {
      doIndent(o, indent);
      o << '(';
      printMedium(o, "delegate ");
      if (curr->delegateTarget == DELEGATE_CALLER_TARGET) {
        o << controlFlowDepth;
      } else {
        printName(curr->delegateTarget, o);
      }
      o << ")\n";
    }
    decIndent();
    if (full) {
      o << " ;; end try";
    }
  }